

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::SaveStartupProfileAndRelease(ScriptContext *this,bool isSaveOnClose)

{
  int iVar1;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  SimpleDictionaryEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_> *pSVar3;
  WriteBarrierPtr<SourceContextInfo> info;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  int iVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  
  if (this->threadContext->isThreadBound == true) {
    if (((this->startupComplete == false) &&
        (pBVar2 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).sourceContextInfoMap.
                  ptr,
        pBVar2 != (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)0x0)) && (pBVar2->bucketCount != 0)) {
      puVar7 = (undefined4 *)
               __tls_get_addr(&PTR_0155fe48,CONCAT71(in_register_00000031,isSaveOnClose));
      uVar9 = 0;
      do {
        iVar8 = (pBVar2->buckets).ptr[uVar9];
        while (iVar8 != -1) {
          pSVar3 = (pBVar2->entries).ptr;
          iVar1 = pSVar3[iVar8].
                  super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.
                  super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                  .
                  super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                  .next;
          info.ptr = pSVar3[iVar8].
                     super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .
                     super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                     .
                     super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                     .
                     super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                     .value.ptr;
          if (((info.ptr)->sourceDynamicProfileManager).ptr == (SourceDynamicProfileManager *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                        ,0x166e,"(info->sourceDynamicProfileManager)",
                                        "info->sourceDynamicProfileManager");
            if (!bVar5) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar7 = 0;
          }
          uVar6 = SourceDynamicProfileManager::SaveToProfileCacheAndRelease
                            (((info.ptr)->sourceDynamicProfileManager).ptr,info.ptr);
          iVar8 = iVar1;
          if (uVar6 != 0) {
            Output::Trace(DynamicProfilePhase,L"Profile saving succeeded\n");
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < pBVar2->bucketCount);
    }
    this->startupComplete = true;
  }
  return;
}

Assistant:

void ScriptContext::SaveStartupProfileAndRelease(bool isSaveOnClose)
    {
        // No need to save profiler info in JSRT scenario at this time.
        if (GetThreadContext()->IsJSRT())
        {
            return;
        }
        if (!startupComplete && this->Cache()->sourceContextInfoMap)
        {
#if ENABLE_PROFILE_INFO
            this->Cache()->sourceContextInfoMap->Map([&](DWORD_PTR dwHostSourceContext, SourceContextInfo* info)
            {
                Assert(info->sourceDynamicProfileManager);
                uint bytesWritten = info->sourceDynamicProfileManager->SaveToProfileCacheAndRelease(info);
                if (bytesWritten > 0)
                {
                    JS_ETW(EventWriteJSCRIPT_PROFILE_SAVE(info->dwHostSourceContext, this, bytesWritten, isSaveOnClose));
                    OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Profile saving succeeded\n"));
                }
            });
#endif
        }
        startupComplete = true;
    }